

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdatabuilder.cpp
# Opt level: O3

void __thiscall
icu_63::DataBuilderCollationIterator::~DataBuilderCollationIterator
          (DataBuilderCollationIterator *this)

{
  SkippedState *this_00;
  void *in_RSI;
  
  (this->super_CollationIterator).super_UObject._vptr_UObject =
       (_func_int **)&PTR__CollationIterator_003a6928;
  this_00 = (this->super_CollationIterator).skipped;
  if (this_00 != (SkippedState *)0x0) {
    UnicodeString::~UnicodeString(&this_00->newBuffer);
    UnicodeString::~UnicodeString(&this_00->oldBuffer);
  }
  UMemory::operator_delete((UMemory *)this_00,in_RSI);
  MaybeStackArray<long,_40>::~MaybeStackArray(&(this->super_CollationIterator).ceBuffer.buffer);
  UObject::~UObject((UObject *)this);
  return;
}

Assistant:

int32_t
DataBuilderCollationIterator::fetchCEs(const UnicodeString &str, int32_t start,
                                       int64_t ces[], int32_t cesLength) {
    // Set the pointers each time, in case they changed due to reallocation.
    builderData.ce32s = reinterpret_cast<const uint32_t *>(builder.ce32s.getBuffer());
    builderData.ces = builder.ce64s.getBuffer();
    builderData.contexts = builder.contexts.getBuffer();
    // Modified copy of CollationIterator::nextCE() and CollationIterator::nextCEFromCE32().
    reset();
    s = &str;
    pos = start;
    UErrorCode errorCode = U_ZERO_ERROR;
    while(U_SUCCESS(errorCode) && pos < s->length()) {
        // No need to keep all CEs in the iterator buffer.
        clearCEs();
        UChar32 c = s->char32At(pos);
        pos += U16_LENGTH(c);
        uint32_t ce32 = utrie2_get32(builder.trie, c);
        const CollationData *d;
        if(ce32 == Collation::FALLBACK_CE32) {
            d = builder.base;
            ce32 = builder.base->getCE32(c);
        } else {
            d = &builderData;
        }
        appendCEsFromCE32(d, c, ce32, /*forward=*/ TRUE, errorCode);
        U_ASSERT(U_SUCCESS(errorCode));
        for(int32_t i = 0; i < getCEsLength(); ++i) {
            int64_t ce = getCE(i);
            if(ce != 0) {
                if(cesLength < Collation::MAX_EXPANSION_LENGTH) {
                    ces[cesLength] = ce;
                }
                ++cesLength;
            }
        }
    }
    return cesLength;
}